

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pool.hpp
# Opt level: O0

void __thiscall iutest::detail::iuPool::push(iuPool *this,value_ptr ptr)

{
  value_ptr local_18;
  value_ptr ptr_local;
  iuPool *this_local;
  
  local_18 = ptr;
  ptr_local = (value_ptr)this;
  std::vector<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>::push_back
            (&this->m_pool,&local_18);
  return;
}

Assistant:

void push(value_ptr ptr) { m_pool.push_back(ptr); }